

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

StatementMap *
Js::FunctionBody::GetPrevNonSubexpressionStatementMap
          (StatementMapList *statementMapList,int *startingAtIndex)

{
  StatementMap *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  StatementMap *pSVar6;
  int index;
  
  if (statementMapList == (StatementMapList *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xb4f,"(statementMapList != nullptr)",
                                "Must have valid statementMapList to execute");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  index = *startingAtIndex;
  while( true ) {
    pTVar5 = JsUtil::
             List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(statementMapList,index);
    pSVar1 = pTVar5->ptr;
    if ((*startingAtIndex == 0) || (pSVar1->isSubexpression != true)) break;
    index = *startingAtIndex + -1;
    *startingAtIndex = index;
  }
  pSVar6 = (StatementMap *)0x0;
  if (pSVar1->isSubexpression == false) {
    pSVar6 = pSVar1;
  }
  return pSVar6;
}

Assistant:

FunctionBody::StatementMap * FunctionBody::GetPrevNonSubexpressionStatementMap(StatementMapList *statementMapList, int & startingAtIndex)
    {
        AssertMsg(statementMapList != nullptr, "Must have valid statementMapList to execute");

        StatementMap *map = statementMapList->Item(startingAtIndex);
        while (startingAtIndex && map->isSubexpression)
        {
            map = statementMapList->Item(--startingAtIndex);
        }
        if (map->isSubexpression)   // Didn't find any non inner maps
        {
            return nullptr;
        }
        return map;
    }